

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O0

void QSqlDatabasePrivate::removeDatabase(QString *name)

{
  byte bVar1;
  bool bVar2;
  Type *db;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QtSqlGlobals *sqlGlobals;
  QWriteLocker locker;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QCoreApplication::instanceExists();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    db = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
         ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
                       *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    QWriteLocker::QWriteLocker
              ((QWriteLocker *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (QReadWriteLock *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    bVar2 = QHash<QString,_QSqlDatabase>::contains
                      ((QHash<QString,_QSqlDatabase> *)db,
                       (QString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (bVar2) {
      QHash<QString,_QSqlDatabase>::take
                ((QHash<QString,_QSqlDatabase> *)db,
                 (QString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      invalidateDb((QSqlDatabase *)db,
                   (QString *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (bool)in_stack_ffffffffffffff9f);
      QSqlDatabase::~QSqlDatabase
                ((QSqlDatabase *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    QWriteLocker::~QWriteLocker((QWriteLocker *)0x11c68a);
  }
  else {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcSqlDb();
    anon_unknown.dwarf_4455c::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
      anon_unknown.dwarf_4455c::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x11c5c0);
      QMessageLogger::QMessageLogger
                (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                 (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                 (char *)0x11c5d6);
      QMessageLogger::warning(local_38,"QSqlDatabase requires a QCoreApplication");
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSqlDatabasePrivate::removeDatabase(const QString &name)
{
    CHECK_QCOREAPPLICATION
    QtSqlGlobals *sqlGlobals = s_sqlGlobals();
    QWriteLocker locker(&sqlGlobals->lock);

    if (!sqlGlobals->connections.contains(name))
        return;

    invalidateDb(sqlGlobals->connections.take(name), name);
}